

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O3

void yprc_type(lys_ypr_ctx *pctx,lysc_type *type)

{
  uint16_t *puVar1;
  ly_out *out;
  char *pcVar2;
  void *pvVar3;
  ulong uVar4;
  LY_DATA_TYPE basetype;
  uint uVar5;
  lysc_ext_instance *plVar6;
  ly_bool *in_R9;
  void *pvVar7;
  ulong uVar8;
  lysc_type_num *num;
  ly_bool flag;
  ly_bool local_29;
  
  local_29 = '\0';
  out = (pctx->field_0).field_0.out;
  uVar5 = 0;
  if ((undefined1  [24])((undefined1  [24])pctx->field_0 & (undefined1  [24])0x200000000) ==
      (undefined1  [24])0x0) {
    uVar5 = (uint)(pctx->field_0).field_0.level * 2;
  }
  pcVar2 = lys_datatype2str(type->basetype);
  ly_print_(out,"%*stype %s",(ulong)uVar5,"",pcVar2);
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 + 1;
  yprc_extension_instances(pctx,LY_STMT_TYPE,'\0',type->exts,&local_29);
  basetype = type->basetype;
  switch(basetype) {
  case LY_TYPE_BINARY:
    plVar6 = (lysc_ext_instance *)type[1].name;
    basetype = LY_TYPE_BINARY;
    goto LAB_0018e3a1;
  case LY_TYPE_UINT8:
  case LY_TYPE_UINT16:
  case LY_TYPE_UINT32:
  case LY_TYPE_UINT64:
  case LY_TYPE_INT8:
  case LY_TYPE_INT16:
  case LY_TYPE_INT32:
  case LY_TYPE_INT64:
    plVar6 = (lysc_ext_instance *)type[1].name;
    goto LAB_0018e3a1;
  case LY_TYPE_STRING:
    yprc_range(pctx,(lysc_range *)type[1].name,LY_TYPE_STRING,&local_29);
    pvVar7 = (void *)0x0;
    while( true ) {
      plVar6 = type[1].exts;
      if (plVar6 == (lysc_ext_instance *)0x0) {
        pvVar3 = (void *)0x0;
      }
      else {
        pvVar3 = plVar6[-1].compiled;
      }
      if (pvVar3 <= pvVar7) break;
      yprc_pattern(pctx,(lysc_pattern *)(&plVar6->def)[(long)pvVar7],&local_29);
      pvVar7 = (void *)((long)pvVar7 + 1);
    }
    break;
  case LY_TYPE_BITS:
  case LY_TYPE_ENUM:
    yprc_bits_enum(pctx,(lysc_type_bitenum_item *)type[1].name,basetype,&local_29);
    break;
  case LY_TYPE_BOOL:
  case LY_TYPE_EMPTY:
    break;
  case LY_TYPE_DEC64:
    if (local_29 == '\0') {
      local_29 = '\x01';
      ly_print_((pctx->field_0).field_0.out," {\n");
    }
    ypr_unsigned(pctx,LY_STMT_FRACTION_DIGITS,(uint8_t)type->exts,
                 (void *)(ulong)*(byte *)&type[1].name,(unsigned_long)&local_29,in_R9);
    plVar6 = type[1].exts;
    basetype = type->basetype;
LAB_0018e3a1:
    yprc_range(pctx,(lysc_range *)plVar6,basetype,&local_29);
    break;
  case LY_TYPE_IDENT:
    uVar8 = 0;
    while( true ) {
      pcVar2 = type[1].name;
      if (pcVar2 == (char *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(pcVar2 + -8);
      }
      if (uVar4 <= uVar8) break;
      if (local_29 == '\0') {
        local_29 = '\x01';
        ly_print_((pctx->field_0).field_0.out," {\n");
        pcVar2 = type[1].name;
      }
      ypr_substmt(pctx,LY_STMT_BASE,(uint8_t)uVar8,(char *)**(undefined8 **)(pcVar2 + uVar8 * 8),
                  '\0',type->exts);
      uVar8 = uVar8 + 1;
    }
    break;
  case LY_TYPE_INST:
    if (local_29 == '\0') {
      local_29 = '\x01';
      ly_print_((pctx->field_0).field_0.out," {\n");
    }
    pcVar2 = "true";
    if (*(char *)&type[1].name == '\0') {
      pcVar2 = "false";
    }
    ypr_substmt(pctx,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar2,'\0',type->exts);
    break;
  case LY_TYPE_LEAFREF:
    if (local_29 == '\0') {
      local_29 = '\x01';
      ly_print_((pctx->field_0).field_0.out," {\n");
    }
    ypr_substmt(pctx,LY_STMT_PATH,'\0',*(char **)(type[1].name + 0x28),'\0',type->exts);
    pcVar2 = "true";
    if ((char)type[1].basetype == LY_TYPE_UNKNOWN) {
      pcVar2 = "false";
    }
    ypr_substmt(pctx,LY_STMT_REQUIRE_INSTANCE,'\0',pcVar2,'\0',type->exts);
    yprc_type(pctx,(lysc_type *)type[1].plugin);
    break;
  case LY_TYPE_UNION:
    uVar8 = 0;
    while( true ) {
      pcVar2 = type[1].name;
      if (pcVar2 == (char *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = *(ulong *)(pcVar2 + -8);
      }
      if (uVar4 <= uVar8) break;
      if (local_29 == '\0') {
        local_29 = '\x01';
        ly_print_((pctx->field_0).field_0.out," {\n");
        pcVar2 = type[1].name;
      }
      yprc_type(pctx,*(lysc_type **)(pcVar2 + uVar8 * 8));
      uVar8 = uVar8 + 1;
    }
    break;
  default:
    ly_log(((pctx->field_0).field_0.module)->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_yang.c",
           0x428);
  }
  puVar1 = &(pctx->field_0).field_0.level;
  *puVar1 = *puVar1 - 1;
  ypr_close(pctx,local_29);
  return;
}

Assistant:

static void
yprc_type(struct lys_ypr_ctx *pctx, const struct lysc_type *type)
{
    LY_ARRAY_COUNT_TYPE u;
    ly_bool flag = 0;

    ly_print_(pctx->out, "%*stype %s", INDENT, lys_datatype2str(type->basetype));
    LEVEL++;

    yprc_extension_instances(pctx, LY_STMT_TYPE, 0, type->exts, &flag);

    switch (type->basetype) {
    case LY_TYPE_BINARY: {
        struct lysc_type_bin *bin = (struct lysc_type_bin *)type;

        yprc_range(pctx, bin->length, type->basetype, &flag);
        break;
    }
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64: {
        struct lysc_type_num *num = (struct lysc_type_num *)type;

        yprc_range(pctx, num->range, type->basetype, &flag);
        break;
    }
    case LY_TYPE_STRING: {
        struct lysc_type_str *str = (struct lysc_type_str *)type;

        yprc_range(pctx, str->length, type->basetype, &flag);
        LY_ARRAY_FOR(str->patterns, u) {
            yprc_pattern(pctx, str->patterns[u], &flag);
        }
        break;
    }
    case LY_TYPE_BITS:
    case LY_TYPE_ENUM: {
        /* bits and enums structures are compatible */
        struct lysc_type_bits *bits = (struct lysc_type_bits *)type;

        yprc_bits_enum(pctx, bits->bits, type->basetype, &flag);
        break;
    }
    case LY_TYPE_BOOL:
    case LY_TYPE_EMPTY:
        /* nothing to do */
        break;
    case LY_TYPE_DEC64: {
        struct lysc_type_dec *dec = (struct lysc_type_dec *)type;

        ypr_open(pctx->out, &flag);
        ypr_unsigned(pctx, LY_STMT_FRACTION_DIGITS, 0, type->exts, dec->fraction_digits, &flag);
        yprc_range(pctx, dec->range, dec->basetype, &flag);
        break;
    }
    case LY_TYPE_IDENT: {
        struct lysc_type_identityref *ident = (struct lysc_type_identityref *)type;

        LY_ARRAY_FOR(ident->bases, u) {
            ypr_open(pctx->out, &flag);
            ypr_substmt(pctx, LY_STMT_BASE, u, ident->bases[u]->name, 0, type->exts);
        }
        break;
    }
    case LY_TYPE_INST: {
        struct lysc_type_instanceid *inst = (struct lysc_type_instanceid *)type;

        ypr_open(pctx->out, &flag);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, inst->require_instance ? "true" : "false", 0, inst->exts);
        break;
    }
    case LY_TYPE_LEAFREF: {
        struct lysc_type_leafref *lr = (struct lysc_type_leafref *)type;

        ypr_open(pctx->out, &flag);
        ypr_substmt(pctx, LY_STMT_PATH, 0, lr->path->expr, 0, lr->exts);
        ypr_substmt(pctx, LY_STMT_REQUIRE_INSTANCE, 0, lr->require_instance ? "true" : "false", 0, lr->exts);
        yprc_type(pctx, lr->realtype);
        break;
    }
    case LY_TYPE_UNION: {
        struct lysc_type_union *un = (struct lysc_type_union *)type;

        LY_ARRAY_FOR(un->types, u) {
            ypr_open(pctx->out, &flag);
            yprc_type(pctx, un->types[u]);
        }
        break;
    }
    default:
        LOGINT(pctx->module->ctx);
    }

    LEVEL--;
    ypr_close(pctx, flag);
}